

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O1

void __thiscall UnitTests::Assert::Error(Assert *this,string *msg)

{
  pointer pcVar1;
  TestFailure *this_00;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = (TestFailure *)__cxa_allocate_exception(0x48);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + msg->_M_string_length);
  std::__cxx11::string::string((string *)&local_48,this->m_file,&local_69);
  TestFailure::TestFailure(this_00,&local_68,&local_48,this->m_line);
  __cxa_throw(this_00,&TestFailure::typeinfo,TestFailure::~TestFailure);
}

Assistant:

[[noreturn]] void Error(const std::string& msg) const { throw TestFailure(msg, m_file, m_line); }